

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O3

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<0,_5,_1>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float afStack_30 [2];
  undefined8 local_28;
  float local_20;
  int aiStack_18 [6];
  
  fVar2 = -0.2;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    fVar4 = evalCtx->in[0].m_data[0];
    fVar6 = evalCtx->in[0].m_data[1];
    fVar3 = evalCtx->in[1].m_data[1];
    fVar5 = evalCtx->in[1].m_data[0];
  }
  else {
    fVar4 = -0.1;
    fVar5 = 1.0;
    fVar3 = 0.0;
    fVar6 = -0.2;
  }
  if (in1Type == INPUTTYPE_DYNAMIC) {
    fVar2 = (evalCtx->coords).m_data[0];
  }
  local_28 = CONCAT44(fVar2 + fVar5,fVar2 + fVar4);
  local_20 = fVar3 + fVar2 + fVar6 + fVar2;
  aiStack_18[2] = 0;
  aiStack_18[3] = 1;
  aiStack_18[4] = 2;
  lVar1 = 2;
  do {
    (evalCtx->color).m_data[aiStack_18[lVar1]] = afStack_30[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);
		typename TypeTraits<In1DataType>::Type	in1	= (in1Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In1DataType>(evalCtx, 1)
																				     : getInputValue<INPUTTYPE_CONST,	In1DataType>(evalCtx, 1);
		evalCtx.color.xyz() = reduceToVec3(in0 + in1);
	}